

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Get(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest,SQUnsignedInteger getflags
         ,SQInteger selfidx)

{
  long lVar1;
  bool bVar2;
  SQInteger SVar3;
  SQObjectPtr *in_RCX;
  SQObjectPtr *in_RDX;
  SQVM *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_R8;
  long in_R9;
  SQWeakRef *w;
  SQInteger len;
  SQInteger n;
  SQInteger in_stack_ffffffffffffff78;
  SQObjectPtr *in_stack_ffffffffffffff80;
  long local_78;
  SQObjectPtr *in_stack_ffffffffffffff90;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQTable *val;
  undefined4 in_stack_ffffffffffffffa8;
  SQObjectType SVar4;
  SQInteger in_stack_ffffffffffffffc0;
  SQVM *pSVar5;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  SVar4 = *(SQObjectType *)&(in_RSI->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
  pSVar5 = in_RDI;
  if (SVar4 == OT_STRING) {
    if (((in_RDX->super_SQObject)._type & 0x4000000) != 0) {
      if ((in_RDX->super_SQObject)._type == OT_FLOAT) {
        local_78 = (long)(in_RDX->super_SQObject)._unVal.fFloat;
      }
      else {
        local_78 = (in_RDX->super_SQObject)._unVal.nInteger;
      }
      lVar1 = ((SQObjectValue *)&(in_RSI->super_SQCollectable).super_SQRefCounted._uiRef)->pString->
              _len;
      if (local_78 < 0) {
        local_78 = lVar1 + local_78;
      }
      if ((-1 < local_78) && (local_78 < lVar1)) {
        ::SQObjectPtr::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        return true;
      }
      if (((ulong)in_R8 & 2) == 0) {
        Raise_IdxError(in_RDI,in_stack_ffffffffffffff98);
      }
      return false;
    }
  }
  else if (SVar4 == OT_ARRAY) {
    if (((in_RDX->super_SQObject)._type & 0x4000000) != 0) {
      val = ((SQObjectValue *)&(in_RSI->super_SQCollectable).super_SQRefCounted._uiRef)->pTable;
      bVar2 = SQArray::Get((SQArray *)CONCAT44(0x8000040,in_stack_ffffffffffffffa8),
                           (SQInteger)in_RDI,(SQObjectPtr *)val);
      if (!bVar2) {
        if (((ulong)in_R8 & 2) == 0) {
          Raise_IdxError(in_RDI,(SQObjectPtr *)val);
        }
        return false;
      }
      return true;
    }
  }
  else if (SVar4 == OT_CLASS) {
    bVar2 = SQClass::Get((SQClass *)CONCAT44(0x8004000,in_stack_ffffffffffffffa8),
                         (SQObjectPtr *)in_RDI,in_stack_ffffffffffffff98);
    if (bVar2) {
      return true;
    }
  }
  else if (SVar4 == OT_TABLE) {
    bVar2 = SQTable::Get((SQTable *)CONCAT44(0xa000020,in_stack_ffffffffffffffa8),
                         (SQObjectPtr *)in_RDI,in_stack_ffffffffffffff98);
    if (bVar2) {
      return true;
    }
  }
  else if ((SVar4 == OT_INSTANCE) &&
          (bVar2 = SQInstance::Get((SQInstance *)CONCAT44(0xa008000,in_stack_ffffffffffffffa8),
                                   (SQObjectPtr *)in_RDI,in_stack_ffffffffffffff98), bVar2)) {
    return true;
  }
  if (((ulong)in_R8 & 1) == 0) {
    SVar3 = FallBackGet((SQVM *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                        (SQObjectPtr *)pSVar5,(SQObjectPtr *)in_RSI,in_RDX);
    if (SVar3 == 0) {
      return true;
    }
    if ((SVar3 != 1) && (SVar3 == 2)) {
      return false;
    }
    bVar2 = InvokeDefaultDelegate
                      ((SQVM *)CONCAT44(SVar4,in_stack_ffffffffffffffa8),(SQObjectPtr *)in_RDI,
                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (bVar2) {
      return true;
    }
  }
  if (((in_R9 == 0) &&
      ((((in_RDI->ci->_closure).super_SQObject._unVal.pTable)->_firstfree->key).super_SQObject.
       _unVal.fFloat != 2.350989e-38)) &&
     (bVar2 = Get(in_RSI,in_RDX,in_RCX,in_R8,0,in_stack_ffffffffffffffc0), bVar2)) {
    bVar2 = true;
  }
  else {
    if (((ulong)in_R8 & 2) == 0) {
      Raise_IdxError(in_RDI,in_stack_ffffffffffffff98);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SQVM::Get(const SQObjectPtr &self, const SQObjectPtr &key, SQObjectPtr &dest, SQUnsignedInteger getflags, SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Get(key,dest))return true;
        break;
    case OT_ARRAY:
        if (sq_isnumeric(key)) { if (_array(self)->Get(tointeger(key), dest)) { return true; } if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key); return false; }
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(key,dest)) return true;
        break;
    case OT_CLASS:
        if(_class(self)->Get(key,dest)) return true;
        break;
    case OT_STRING:
        if(sq_isnumeric(key)){
            SQInteger n = tointeger(key);
            SQInteger len = _string(self)->_len;
            if (n < 0) { n += len; }
            if (n >= 0 && n < len) {
                dest = SQInteger(_stringval(self)[n]);
                return true;
            }
            if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
            return false;
        }
        break;
    default:break; //shut up compiler
    }
    if ((getflags & GET_FLAG_RAW) == 0) {
        switch(FallBackGet(self,key,dest)) {
            case FALLBACK_OK: return true; //okie
            case FALLBACK_NO_MATCH: break; //keep falling back
            case FALLBACK_ERROR: return false; // the metamethod failed
        }
        if(InvokeDefaultDelegate(self,key,dest)) {
            return true;
        }
    }
//#ifdef ROOT_FALLBACK
    if(selfidx == 0) {
        SQWeakRef *w = _closure(ci->_closure)->_root;
        if(type(w->_obj) != OT_NULL)
        {
            if(Get(*((const SQObjectPtr *)&w->_obj),key,dest,0,DONT_FALL_BACK)) return true;
        }

    }
//#endif
    if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
    return false;
}